

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O3

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,PowConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>
          *prepro)

{
  double __y;
  double __y_00;
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  array<double,_4UL> rb;
  double local_30 [4];
  
  lVar2 = (long)(c->
                super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
                args_._M_elems[0];
  dVar8 = *(double *)(*(long *)(this + 0x40) + lVar2 * 8);
  if (0.0 <= dVar8) {
    lVar4 = (long)(c->
                  super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>)
                  .args_._M_elems[1];
    dVar9 = *(double *)(*(long *)(this + 0x58) + lVar2 * 8);
    __y = *(double *)(*(long *)(this + 0x40) + lVar4 * 8);
    __y_00 = *(double *)(*(long *)(this + 0x58) + lVar4 * 8);
    if ((1e-10 <= dVar8) || (1e-10 <= __y)) {
      dVar7 = pow(dVar8,__y);
      pdVar3 = local_30;
      local_30[0] = dVar7;
      local_30[1] = pow(dVar8,__y_00);
      local_30[2] = pow(dVar9,__y);
      local_30[3] = pow(dVar9,__y_00);
      lVar2 = 8;
      dVar8 = dVar7;
      do {
        dVar9 = *(double *)((long)local_30 + lVar2);
        pdVar1 = (double *)((long)local_30 + lVar2);
        if (dVar8 <= dVar9) {
          dVar9 = dVar8;
          pdVar1 = pdVar3;
        }
        pdVar3 = pdVar1;
        dVar8 = dVar9;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x20);
      dVar8 = *pdVar3;
      pdVar3 = local_30;
      lVar2 = 8;
      do {
        dVar9 = *(double *)((long)local_30 + lVar2);
        pdVar1 = (double *)((long)local_30 + lVar2);
        if (dVar9 <= dVar7) {
          dVar9 = dVar7;
          pdVar1 = pdVar3;
        }
        pdVar3 = pdVar1;
        lVar2 = lVar2 + 8;
        dVar7 = dVar9;
      } while (lVar2 != 0x20);
    }
    else {
      dVar7 = pow(1e-10,__y);
      pdVar3 = local_30;
      local_30[0] = dVar7;
      local_30[1] = pow(1e-10,__y_00);
      local_30[2] = pow(dVar9,__y);
      local_30[3] = pow(dVar9,__y_00);
      lVar2 = 8;
      dVar8 = dVar7;
      do {
        dVar9 = *(double *)((long)local_30 + lVar2);
        pdVar1 = (double *)((long)local_30 + lVar2);
        if (dVar8 <= dVar9) {
          dVar9 = dVar8;
          pdVar1 = pdVar3;
        }
        pdVar3 = pdVar1;
        dVar8 = dVar9;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x20);
      dVar8 = *pdVar3;
      pdVar3 = local_30;
      lVar2 = 8;
      do {
        dVar9 = *(double *)((long)local_30 + lVar2);
        pdVar1 = (double *)((long)local_30 + lVar2);
        if (dVar9 <= dVar7) {
          dVar9 = dVar7;
          pdVar1 = pdVar3;
        }
        pdVar3 = pdVar1;
        lVar2 = lVar2 + 8;
        dVar7 = dVar9;
      } while (lVar2 != 0x20);
    }
    dVar9 = *pdVar3;
    uVar5 = -(ulong)(prepro->lb_ < dVar8);
    uVar6 = -(ulong)(dVar9 < prepro->ub_);
    prepro->lb_ = (double)(~uVar5 & (ulong)prepro->lb_ | (ulong)dVar8 & uVar5);
    prepro->ub_ = (double)(~uVar6 & (ulong)prepro->ub_ | (ulong)dVar9 & uVar6);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      PowConstraint& c, PreprocessInfo& prepro) {
    auto x = c.GetArguments()[0];
    auto lbx = MPCD( lb(x) );
    if (lbx >= 0.0) {
      auto y = c.GetArguments()[1];
      auto ubx = MPCD( ub(x) );
      auto lby = MPCD( lb(y) );
      auto uby = MPCD( ub(y) );
      if (lbx >= 1e-10 || lby >= 1e-10) {
        std::array<double, 4> rb
            {std::pow(lbx, lby), std::pow(lbx, uby),
                                 std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      } else {
        std::array<double, 4> rb
            {std::pow(1e-10, lby), std::pow(1e-10, uby),
             std::pow(ubx, lby), std::pow(ubx, uby)};
        prepro.narrow_result_bounds(
            *std::min_element(rb.begin(), rb.end()),
            *std::max_element(rb.begin(), rb.end()) );
      }
    }
  }